

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall
TPZMHMeshControl::DefinePartition(TPZMHMeshControl *this,TPZVec<long> *partitionindex)

{
  int iVar1;
  TPZGeoMesh *this_00;
  long lVar2;
  _func_int **pp_Var3;
  TPZGeoEl *pTVar4;
  TPZGeoEl *pTVar5;
  int iVar6;
  int iVar7;
  TPZGeoEl *pTVar8;
  mapped_type *pmVar9;
  long lVar10;
  int64_t iel;
  int iVar11;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  TPZGeoElBC bc;
  TPZGeoElSide neighbour_1;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  skeleton;
  
  this_00 = ((this->fGMesh).fRef)->fPointer;
  skeleton._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &skeleton._M_t._M_impl.super__Rb_tree_header._M_header;
  skeleton._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  skeleton._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  skeleton._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar1 = this_00->fDim;
  lVar10 = (this_00->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  iel = 0;
  skeleton._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       skeleton._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (lVar10 < 1) {
    lVar10 = iel;
  }
  do {
    if (iel == lVar10) {
      DefinePartition(this,partitionindex,&skeleton);
      std::
      _Rb_tree<long,_std::pair<const_long,_std::pair<long,_long>_>,_std::_Select1st<std::pair<const_long,_std::pair<long,_long>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
      ::~_Rb_tree(&skeleton._M_t);
      return;
    }
    pTVar8 = TPZGeoMesh::Element(this_00,iel);
    iVar6 = (**(code **)(*(long *)pTVar8 + 0x1d0))(pTVar8);
    if (iVar6 == 0) {
      iVar6 = (**(code **)(*(long *)pTVar8 + 0x210))(pTVar8);
      if (iVar6 == iVar1 + -1) {
        iVar6 = (**(code **)(*(long *)pTVar8 + 0xf0))(pTVar8);
        gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
        gelside.fSide = iVar6 + -1;
        gelside.fGeoEl = pTVar8;
        TPZGeoElSide::Neighbour(&neighbour,&gelside);
        iVar6 = (**(code **)(*(long *)neighbour.fGeoEl + 0x210))();
        if (iVar6 != iVar1) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                     ,0x75);
        }
        lVar2 = partitionindex->fStore[(neighbour.fGeoEl)->fIndex];
        pp_Var3 = (_func_int **)pTVar8->fIndex;
        neighbour_1.super_TPZSavable._vptr_TPZSavable = pp_Var3;
        pmVar9 = std::
                 map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                 ::operator[](&skeleton,(key_type_conflict1 *)&neighbour_1);
        pmVar9->first = (long)(int)lVar2;
        pmVar9->second = (long)pp_Var3;
      }
      else {
        iVar6 = (**(code **)(*(long *)pTVar8 + 0xf0))(pTVar8);
        iVar11 = 0;
        if (iVar6 < 1) {
          iVar6 = iVar11;
        }
        for (; iVar11 != iVar6; iVar11 = iVar11 + 1) {
          neighbour.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
          neighbour.fGeoEl = pTVar8;
          neighbour.fSide = iVar11;
          iVar7 = TPZGeoElSide::Dimension(&neighbour);
          if (iVar7 == iVar1 + -1) {
            TPZGeoElSide::Neighbour(&neighbour_1,&neighbour);
            iVar7 = (**(code **)(*(long *)neighbour_1.fGeoEl + 0x210))();
            if (iVar7 == iVar1) {
              pTVar4 = (TPZGeoEl *)partitionindex->fStore[pTVar8->fIndex];
              pTVar5 = (TPZGeoEl *)partitionindex->fStore[(neighbour_1.fGeoEl)->fIndex];
              if (pTVar4 != pTVar5) {
                TPZGeoElSide::Neighbour(&gelside,&neighbour);
                while( true ) {
                  neighbour_1.fSide = gelside.fSide;
                  neighbour_1.fGeoEl = gelside.fGeoEl;
                  if ((gelside.fGeoEl == neighbour.fGeoEl) && (gelside.fSide == neighbour.fSide))
                  break;
                  if ((gelside.fGeoEl)->fMatId == this->fSkeletonMatId) goto LAB_011e2fa6;
                  TPZGeoElSide::Neighbour(&gelside,&neighbour_1);
                }
                TPZGeoElBC::TPZGeoElBC(&bc,&neighbour,this->fSkeletonMatId);
                if ((TPZGeoEl *)(bc.fCreatedElement)->fIndex == pTVar5) {
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                             ,0xa7);
                }
                gelside.super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)(bc.fCreatedElement)->fIndex;
                gelside.fGeoEl = pTVar4;
                gelside._16_8_ = pTVar5;
                std::
                _Rb_tree<long,std::pair<long_const,std::pair<long,long>>,std::_Select1st<std::pair<long_const,std::pair<long,long>>>,std::less<long>,std::allocator<std::pair<long_const,std::pair<long,long>>>>
                ::_M_insert_unique<std::pair<long_const,std::pair<long,long>>>
                          ((_Rb_tree<long,std::pair<long_const,std::pair<long,long>>,std::_Select1st<std::pair<long_const,std::pair<long,long>>>,std::less<long>,std::allocator<std::pair<long_const,std::pair<long,long>>>>
                            *)&skeleton,(pair<const_long,_std::pair<long,_long>_> *)&gelside);
              }
            }
          }
LAB_011e2fa6:
        }
      }
    }
    iel = iel + 1;
  } while( true );
}

Assistant:

void TPZMHMeshControl::DefinePartition(TPZVec<int64_t> &partitionindex) {

    TPZGeoMesh *gmesh = this->fGMesh.operator->();

    // Creates skeleton elements
    std::map<int64_t, std::pair<int64_t, int64_t>> skeleton;

    int dim = gmesh->Dimension();

    const int64_t nel = gmesh->NElements();
    for (int64_t iel = 0; iel < nel; iel++) {

        TPZGeoEl *gel = gmesh->Element(iel);

        if (gel->HasSubElement()) continue;
        if (gel->Dimension() == dim-1)
        {
            TPZGeoElSide gelside(gel,gel->NSides()-1);
            TPZGeoElSide neighbour = gelside.Neighbour();
            if(neighbour.Element()->Dimension() != dim) DebugStop();
            int partition = partitionindex[neighbour.Element()->Index()];
            int64_t neighindex = neighbour.Element()->Index();
            auto val = std::pair<int64_t,int64_t>(partition,gel->Index());
            skeleton[gel->Index()] = val;
            continue;
        }

        // Iterates through the sides of the element
        int nsides = gel->NSides();

        for (int iside = 0; iside < nsides; iside++) {

            TPZGeoElSide gelside(gel, iside);

            // Filters boundary sides
            if (gelside.Dimension() != dim - 1) continue;

            TPZGeoElSide neighbour = gelside.Neighbour();

            // Filters neighbour sides that belong to volume elements
            if (neighbour.Element()->Dimension() != dim) continue;

            int64_t thisId = gel->Index();
            int64_t neighId = neighbour.Element()->Index();

            // This lambda checks if a skeleton has already been created over gelside
            auto hasSkeletonNeighbour = [&]() -> bool {
                neighbour = gelside.Neighbour();
                while (neighbour != gelside) {
                    int neighbourMatId = neighbour.Element()->MaterialId();
                    if (neighbourMatId == fSkeletonMatId) {
                        return true;
                    }
                   neighbour = neighbour.Neighbour();
                }
                return false;
            };

            int64_t thisGroup = partitionindex[thisId];
            int64_t neighGroup = partitionindex[neighId];

            if (thisGroup != neighGroup) {
                if (!hasSkeletonNeighbour()) {
                    TPZGeoElBC bc(gelside, fSkeletonMatId);
                    std::pair<int64_t, int64_t> adjacentGroupIndexes(thisGroup, neighGroup);
                    int64_t bc_index = bc.CreatedElement()->Index();
                    if(bc_index == neighGroup)
                    {
                        // you are unwillingly creating a boundary skeleton
                        DebugStop();
                    }
                    skeleton.insert({bc.CreatedElement()->Index(), adjacentGroupIndexes});
                }
            }
        }
    }

    DefinePartition(partitionindex, skeleton);
}